

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_deriveSeqStoreChunk
               (seqStore_t *resultSeqStore,seqStore_t *originalSeqStore,size_t startIdx,
               size_t endIdx)

{
  size_t sVar1;
  ulong in_RCX;
  ulong in_RDX;
  long *in_RSI;
  seqStore_t *in_RDI;
  size_t literalsBytes;
  
  memcpy(in_RDI,in_RSI,0x50);
  if (in_RDX != 0) {
    in_RDI->sequences = (seqDef *)(*in_RSI + in_RDX * 8);
    sVar1 = ZSTD_countSeqStoreLiteralsBytes(in_RDI);
    in_RDI->litStart = in_RDI->litStart + sVar1;
  }
  if ((int)in_RSI[9] != 0) {
    if ((*(uint *)((long)in_RSI + 0x4c) < in_RDX) || (in_RCX < *(uint *)((long)in_RSI + 0x4c))) {
      in_RDI->longLengthType = ZSTD_llt_none;
    }
    else {
      in_RDI->longLengthPos = in_RDI->longLengthPos - (int)in_RDX;
    }
  }
  in_RDI->sequencesStart = (seqDef *)(*in_RSI + in_RDX * 8);
  in_RDI->sequences = (seqDef *)(*in_RSI + in_RCX * 8);
  if (in_RCX == in_RSI[1] - *in_RSI >> 3) {
    if (in_RDI->lit != (BYTE *)in_RSI[3]) {
      __assert_fail("resultSeqStore->lit == originalSeqStore->lit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x5fd0,
                    "void ZSTD_deriveSeqStoreChunk(seqStore_t *, const seqStore_t *, size_t, size_t)"
                   );
    }
  }
  else {
    sVar1 = ZSTD_countSeqStoreLiteralsBytes(in_RDI);
    in_RDI->lit = in_RDI->litStart + sVar1;
  }
  in_RDI->llCode = in_RDI->llCode + in_RDX;
  in_RDI->mlCode = in_RDI->mlCode + in_RDX;
  in_RDI->ofCode = in_RDI->ofCode + in_RDX;
  return;
}

Assistant:

static void ZSTD_deriveSeqStoreChunk(seqStore_t* resultSeqStore,
                               const seqStore_t* originalSeqStore,
                                     size_t startIdx, size_t endIdx)
{
    *resultSeqStore = *originalSeqStore;
    if (startIdx > 0) {
        resultSeqStore->sequences = originalSeqStore->sequencesStart + startIdx;
        resultSeqStore->litStart += ZSTD_countSeqStoreLiteralsBytes(resultSeqStore);
    }

    /* Move longLengthPos into the correct position if necessary */
    if (originalSeqStore->longLengthType != ZSTD_llt_none) {
        if (originalSeqStore->longLengthPos < startIdx || originalSeqStore->longLengthPos > endIdx) {
            resultSeqStore->longLengthType = ZSTD_llt_none;
        } else {
            resultSeqStore->longLengthPos -= (U32)startIdx;
        }
    }
    resultSeqStore->sequencesStart = originalSeqStore->sequencesStart + startIdx;
    resultSeqStore->sequences = originalSeqStore->sequencesStart + endIdx;
    if (endIdx == (size_t)(originalSeqStore->sequences - originalSeqStore->sequencesStart)) {
        /* This accounts for possible last literals if the derived chunk reaches the end of the block */
        assert(resultSeqStore->lit == originalSeqStore->lit);
    } else {
        size_t const literalsBytes = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore);
        resultSeqStore->lit = resultSeqStore->litStart + literalsBytes;
    }
    resultSeqStore->llCode += startIdx;
    resultSeqStore->mlCode += startIdx;
    resultSeqStore->ofCode += startIdx;
}